

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O2

void __thiscall
vkb::detail::GenericFeatureChain::add<VkPhysicalDeviceVulkan14Features>
          (GenericFeatureChain *this,VkPhysicalDeviceVulkan14Features *features)

{
  pointer this_00;
  GenericFeaturesPNextNode local_420;
  
  this_00 = (this->nodes).
            super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (this_00 ==
        (this->nodes).
        super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      GenericFeaturesPNextNode::GenericFeaturesPNextNode<VkPhysicalDeviceVulkan14Features>
                (&local_420,features);
      std::
      vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
      ::emplace_back<vkb::detail::GenericFeaturesPNextNode>(&this->nodes,&local_420);
      return;
    }
    if (features->sType == this_00->sType) break;
    this_00 = this_00 + 1;
  }
  GenericFeaturesPNextNode::GenericFeaturesPNextNode<VkPhysicalDeviceVulkan14Features>
            (&local_420,features);
  GenericFeaturesPNextNode::combine(this_00,&local_420);
  return;
}

Assistant:

void add(T const& features) noexcept {
        // If this struct is already in the list, combine it
        for (auto& node : nodes) {
            if (static_cast<VkStructureType>(features.sType) == node.sType) {
                node.combine(features);
                return;
            }
        }
        // Otherwise append to the end
        nodes.push_back(features);
    }